

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_assert.h
# Opt level: O2

void TestEq<double,double>(double expval,double val,char *file,int line,char *func)

{
  stringstream ss2;
  stringstream ss1;
  char *local_370 [4];
  char *local_350 [4];
  stringstream local_330 [392];
  stringstream local_1a8 [392];
  
  if ((expval != val) || (NAN(expval) || NAN(val))) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::ostream::_M_insert<double>(expval);
    std::__cxx11::stringstream::stringstream(local_330);
    std::ostream::_M_insert<double>(val);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringbuf::str();
    TestFail(local_350[0],local_370[0],file,line,func);
    std::__cxx11::string::~string((string *)local_370);
    std::__cxx11::string::~string((string *)local_350);
    std::__cxx11::stringstream::~stringstream(local_330);
    std::__cxx11::stringstream::~stringstream(local_1a8);
  }
  else {
    testing_success = testing_success + 1;
  }
  return;
}

Assistant:

void TestEq(T expval, U val, const char *file, int line, const char *func = 0)
  {
  if (U(expval) != val)
    {
    std::stringstream ss1;
    ss1 << expval;
    std::stringstream ss2;
    ss2 << val;
    TestFail(ss1.str().c_str(), ss2.str().c_str(), file, line, func);
    }
  else
    ++testing_success;
  }